

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::getRelevantTypes(wasm::Type_
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,void *this,
          Type type)

{
  initializer_list<wasm::Type> __l;
  bool bVar1;
  ulong uVar2;
  HeapType *pHVar3;
  undefined1 extraout_DL;
  _Storage<wasm::HeapType,_true> local_a8;
  optional<wasm::HeapType> super;
  Type local_90;
  uintptr_t local_88;
  Type local_80;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_78;
  Nullability local_5c;
  HeapType HStack_58;
  Nullability nullability;
  HeapType heapType;
  allocator<wasm::Type> local_39;
  Type local_38;
  iterator local_30;
  size_type local_28;
  void *local_20;
  Scanner *this_local;
  Type type_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *ret;
  
  local_20 = this;
  this_local = (Scanner *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  uVar2 = wasm::Type::isRef();
  if ((uVar2 & 1) == 0) {
    local_38.id = (uintptr_t)this_local;
    local_30 = &local_38;
    local_28 = 1;
    std::allocator<wasm::Type>::allocator(&local_39);
    __l._M_len = local_28;
    __l._M_array = local_30;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,&local_39);
    std::allocator<wasm::Type>::~allocator(&local_39);
  }
  else {
    heapType.id._3_1_ = 0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
    HStack_58.id = wasm::Type::getHeapType();
    local_5c = wasm::Type::getNullability();
    if (local_5c == NonNullable) {
      local_88 = HStack_58.id;
      wasm::Type::Type(&local_80,HStack_58,Nullable);
      Type_(&local_78,this,local_80);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
                (__return_storage_ptr__,&local_78);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_78);
    }
    while( true ) {
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = HStack_58.id;
      wasm::Type::Type(&local_90,HStack_58,local_5c);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                (__return_storage_ptr__,&local_90);
      local_a8 = (_Storage<wasm::HeapType,_true>)wasm::HeapType::getSuperType();
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_a8._M_value);
      if (!bVar1) break;
      pHVar3 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_a8._M_value);
      HStack_58.id = pHVar3->id;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      auto heapType = type.getHeapType();
      auto nullability = type.getNullability();

      if (nullability == NonNullable) {
        ret = getRelevantTypes(Type(heapType, Nullable));
      }

      while (1) {
        ret.push_back(Type(heapType, nullability));
        // TODO: handle basic supertypes too
        auto super = heapType.getSuperType();
        if (!super) {
          break;
        }
        heapType = *super;
      }

      return ret;
    }